

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O2

void __thiscall glslang::TLiveTraverser::pushGlobalReference(TLiveTraverser *this,TString *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  value_type pTVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_02;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  uint uVar7;
  TIntermAggregate *candidate;
  value_type local_30;
  
  iVar2 = (*this->intermediate->treeRoot->_vptr_TIntermNode[6])();
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))
                    ((long *)CONCAT44(extraout_var,iVar2));
  uVar7 = 0;
  do {
    if ((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 3) <= (ulong)uVar7) {
      return;
    }
    pTVar4 = (value_type)
             (**(code **)(**(long **)(*(long *)(lVar3 + 8) + (ulong)uVar7 * 8) + 0x30))();
    local_30 = pTVar4;
    if (((pTVar4 != (value_type)0x0) && ((pTVar4->super_TIntermOperator).op == EOpSequence)) &&
       (iVar2 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(pTVar4),
       *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x10) -
       *(long *)(CONCAT44(extraout_var_00,iVar2) + 8) == 8)) {
      iVar2 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(pTVar4);
      lVar5 = (**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_01,iVar2) + 8) + 0x40))
                        ();
      if (lVar5 != 0) {
        iVar2 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(pTVar4);
        plVar6 = (long *)(**(code **)(*(long *)**(undefined8 **)
                                                 (CONCAT44(extraout_var_02,iVar2) + 8) + 0x40))();
        plVar6 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
        plVar6 = (long *)(**(code **)(*plVar6 + 0x60))(plVar6);
        if ((plVar6 != (long *)0x0) &&
           (lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6), (*(uint *)(lVar5 + 8) & 0x7f) == 1)) {
          __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*plVar6 + 400))(plVar6);
          bVar1 = std::operator==(__lhs,name);
          if (bVar1) {
            std::__cxx11::
            list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::
            push_back(&this->destinations,&local_30);
            return;
          }
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void pushGlobalReference(const TString& name)
    {
        TIntermSequence& globals = intermediate.getTreeRoot()->getAsAggregate()->getSequence();
        for (unsigned int f = 0; f < globals.size(); ++f) {
            TIntermAggregate* candidate = globals[f]->getAsAggregate();
            if (candidate && candidate->getOp() == EOpSequence &&
                candidate->getSequence().size() == 1 &&
                candidate->getSequence()[0]->getAsBinaryNode()) {
                TIntermBinary* binary = candidate->getSequence()[0]->getAsBinaryNode();
                TIntermSymbol* symbol = binary->getLeft()->getAsSymbolNode();
                if (symbol && symbol->getQualifier().storage == EvqGlobal &&
                    symbol->getName() == name) {
                    destinations.push_back(candidate);
                    break;
                }
            }
        }
    }